

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleProtectEncoding
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_4)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  bool bVar1;
  ParenPragmaExpressionSyntax *pPVar2;
  uint *puVar3;
  SyntaxNode *in_RCX;
  Diagnostic *in_RDI;
  SourceRange SVar4;
  string_view sVar5;
  optional<unsigned_int> num_1;
  optional<unsigned_int> num;
  string valueText;
  Token value;
  string_view name;
  NameValuePragmaExpressionSyntax *nvp;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  Diagnostic *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  Preprocessor *in_stack_fffffffffffffd58;
  SourceLocation in_stack_fffffffffffffd60;
  SourceLocation in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  DiagCode in_stack_fffffffffffffd74;
  allocator<char> *in_stack_fffffffffffffd78;
  Diagnostic *in_stack_fffffffffffffd80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd88;
  size_t in_stack_fffffffffffffd98;
  SyntaxNode *in_stack_fffffffffffffda0;
  PragmaExpressionSyntax *in_stack_fffffffffffffdf0;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffdf8;
  allocator<char> local_121;
  string_view local_120;
  Token local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  size_t local_d0;
  char *local_c8;
  string_view local_c0;
  NameValuePragmaExpressionSyntax *local_b0;
  string_view local_a8;
  SourceRange local_98;
  undefined4 local_84;
  SyntaxNode *local_80;
  const_iterator local_78;
  const_iterator local_68;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *local_58;
  string_view local_50;
  SourceRange local_40;
  undefined4 local_2c;
  SyntaxNode *local_20;
  
  local_20 = in_RCX;
  if ((in_RCX != (SyntaxNode *)0x0) && (in_RCX->kind == ParenPragmaExpression)) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(in_RCX);
    bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                      ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x380470);
    if (!bVar1) {
      *(undefined4 *)((long)&in_RDI[5].symbol + 4) = 0;
      *(undefined4 *)
       &in_RDI[6].args.
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 0;
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(local_20);
      local_58 = &pPVar2->values;
      local_68 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x38056e);
      local_78 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x38058b);
      sVar5._M_str = in_stack_fffffffffffffd50;
      sVar5._M_len = (size_t)in_stack_fffffffffffffd58;
      while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                               ((self_type *)sVar5._M_str,
                                (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                                in_stack_fffffffffffffd48), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_80 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                                 *)0x3805c8)->super_SyntaxNode;
        if (local_80->kind == NameValuePragmaExpression) {
          local_b0 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                               (local_80);
          local_c0 = Token::valueText((Token *)in_stack_fffffffffffffd60);
          local_d0 = local_c0._M_len;
          local_c8 = local_c0._M_str;
          local_e0 = sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
          __x._M_str = (char *)in_stack_fffffffffffffd80;
          __x._M_len = (size_t)in_stack_fffffffffffffd78;
          __y._M_str._0_4_ = in_stack_fffffffffffffd70;
          __y._M_len = (size_t)in_stack_fffffffffffffd68;
          __y._M_str._4_4_ = in_stack_fffffffffffffd74;
          bVar1 = std::operator==(__x,__y);
          if (bVar1) {
            not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                      ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x380726);
            local_f0 = slang::syntax::SyntaxNode::getFirstToken
                                 ((SyntaxNode *)in_stack_fffffffffffffd80);
            local_120 = Token::valueText((Token *)in_stack_fffffffffffffd60);
            in_stack_fffffffffffffd78 = &local_121;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                       in_stack_fffffffffffffd88,(allocator<char> *)in_stack_fffffffffffffd80);
            std::allocator<char>::~allocator(&local_121);
            strToLower((string *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
            sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       sVar5._M_str);
            __x_00._M_str = (char *)in_stack_fffffffffffffd80;
            __x_00._M_len = (size_t)in_stack_fffffffffffffd78;
            __y_00._M_str._0_4_ = in_stack_fffffffffffffd70;
            __y_00._M_len = (size_t)in_stack_fffffffffffffd68;
            __y_00._M_str._4_4_ = in_stack_fffffffffffffd74;
            bVar1 = std::operator==(__x_00,__y_00);
            if (bVar1) {
              *(undefined4 *)
               ((long)&in_RDI[6].args.
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
            }
            else {
              sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         sVar5._M_str);
              __x_01._M_str = (char *)in_stack_fffffffffffffd80;
              __x_01._M_len = (size_t)in_stack_fffffffffffffd78;
              __y_01._M_str._0_4_ = in_stack_fffffffffffffd70;
              __y_01._M_len = (size_t)in_stack_fffffffffffffd68;
              __y_01._M_str._4_4_ = in_stack_fffffffffffffd74;
              bVar1 = std::operator==(__x_01,__y_01);
              if (bVar1) {
                *(undefined4 *)
                 ((long)&in_RDI[6].args.
                         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4) = 1;
              }
              else {
                sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           sVar5._M_str);
                __x_02._M_str = (char *)in_stack_fffffffffffffd80;
                __x_02._M_len = (size_t)in_stack_fffffffffffffd78;
                __y_02._M_str._0_4_ = in_stack_fffffffffffffd70;
                __y_02._M_len = (size_t)in_stack_fffffffffffffd68;
                __y_02._M_str._4_4_ = in_stack_fffffffffffffd74;
                bVar1 = std::operator==(__x_02,__y_02);
                if (bVar1) {
                  *(undefined4 *)
                   ((long)&in_RDI[6].args.
                           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) = 2;
                }
                else {
                  sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             sVar5._M_str);
                  __x_03._M_str = (char *)in_stack_fffffffffffffd80;
                  __x_03._M_len = (size_t)in_stack_fffffffffffffd78;
                  __y_03._M_str._0_4_ = in_stack_fffffffffffffd70;
                  __y_03._M_len = (size_t)in_stack_fffffffffffffd68;
                  __y_03._M_str._4_4_ = in_stack_fffffffffffffd74;
                  bVar1 = std::operator==(__x_03,__y_03);
                  if (bVar1) {
                    *(undefined4 *)
                     ((long)&in_RDI[6].args.
                             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4) = 3;
                  }
                  else {
                    *(undefined4 *)
                     ((long)&in_RDI[6].args.
                             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4) = 3;
                    SVar4 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffd74,
                                                           in_stack_fffffffffffffd70));
                    in_stack_fffffffffffffd68 = SVar4.endLoc;
                    in_stack_fffffffffffffd70 = SVar4.startLoc._0_4_;
                    in_stack_fffffffffffffd74 = SVar4.startLoc._4_4_;
                    SVar4.endLoc = in_stack_fffffffffffffd68;
                    SVar4.startLoc = in_stack_fffffffffffffd60;
                    in_stack_fffffffffffffd60 =
                         (SourceLocation)
                         addDiag((Preprocessor *)sVar5._M_len,in_stack_fffffffffffffd74,SVar4);
                    sVar5 = Token::valueText((Token *)in_stack_fffffffffffffd60);
                    arg_02._M_str = (char *)in_stack_fffffffffffffda0;
                    arg_02._M_len = in_stack_fffffffffffffd98;
                    Diagnostic::operator<<(in_RDI,arg_02);
                  }
                }
              }
            }
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       sVar5._M_str);
          }
          else {
            sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
            __x_04._M_str = (char *)in_stack_fffffffffffffd80;
            __x_04._M_len = (size_t)in_stack_fffffffffffffd78;
            __y_04._M_str._0_4_ = in_stack_fffffffffffffd70;
            __y_04._M_len = (size_t)in_stack_fffffffffffffd68;
            __y_04._M_str._4_4_ = in_stack_fffffffffffffd74;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                        ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x380b40);
              in_stack_fffffffffffffdf8 =
                   (_Optional_payload_base<unsigned_int>)
                   requireUInt32((Preprocessor *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0
                                );
              bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x380b62);
              if (bVar1) {
                puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x380b75);
                *(uint *)((long)&in_RDI[5].symbol + 4) = *puVar3;
              }
            }
            else {
              in_stack_fffffffffffffdf0 = (PragmaExpressionSyntax *)local_c0._M_str;
              sv(sVar5._M_str,(size_t)in_stack_fffffffffffffd48);
              __x_05._M_str = (char *)in_stack_fffffffffffffd80;
              __x_05._M_len = (size_t)in_stack_fffffffffffffd78;
              __y_05._M_str._0_4_ = in_stack_fffffffffffffd70;
              __y_05._M_len = (size_t)in_stack_fffffffffffffd68;
              __y_05._M_str._4_4_ = in_stack_fffffffffffffd74;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x380c07);
                requireUInt32((Preprocessor *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
                bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x380c29);
                if (bVar1) {
                  puVar3 = std::optional<unsigned_int>::operator*
                                     ((optional<unsigned_int> *)0x380c3c);
                  *(uint *)&in_RDI[6].args.
                            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = *puVar3;
                }
              }
              else {
                bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_c0);
                if (!bVar1) {
                  Token::range((Token *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70
                                                ));
                  range_01.endLoc = in_stack_fffffffffffffd68;
                  range_01.startLoc = in_stack_fffffffffffffd60;
                  in_stack_fffffffffffffd48 =
                       addDiag((Preprocessor *)sVar5._M_len,in_stack_fffffffffffffd74,range_01);
                  Token::valueText((Token *)in_stack_fffffffffffffd60);
                  arg_03._M_str = (char *)in_stack_fffffffffffffda0;
                  arg_03._M_len = in_stack_fffffffffffffd98;
                  Diagnostic::operator<<(in_RDI,arg_03);
                  in_stack_fffffffffffffd98 = local_c0._M_len;
                  in_stack_fffffffffffffda0 = (SyntaxNode *)local_c0._M_str;
                  Diagnostic::operator<<(in_RDI,local_c0);
                }
              }
            }
          }
        }
        else {
          local_84 = 0x270004;
          local_98 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffda0);
          range_00.endLoc = in_stack_fffffffffffffd68;
          range_00.startLoc = in_stack_fffffffffffffd60;
          in_stack_fffffffffffffd80 =
               addDiag((Preprocessor *)sVar5._M_len,in_stack_fffffffffffffd74,range_00);
          local_a8 = Token::valueText((Token *)in_stack_fffffffffffffd60);
          arg_01._M_str = (char *)in_stack_fffffffffffffda0;
          arg_01._M_len = in_stack_fffffffffffffd98;
          Diagnostic::operator<<(in_RDI,arg_01);
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                    *)sVar5._M_str);
      }
      return;
    }
  }
  local_2c = 0x270004;
  if (local_20 == (SyntaxNode *)0x0) {
    local_40 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  }
  else {
    local_40 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffda0);
  }
  range.endLoc = in_stack_fffffffffffffd68;
  range.startLoc = in_stack_fffffffffffffd60;
  addDiag(in_stack_fffffffffffffd58,in_stack_fffffffffffffd74,range);
  local_50 = Token::valueText((Token *)in_stack_fffffffffffffd60);
  arg_00._M_str = (char *)in_stack_fffffffffffffda0;
  arg_00._M_len = in_stack_fffffffffffffd98;
  Diagnostic::operator<<(in_RDI,arg_00);
  return;
}

Assistant:

void Preprocessor::handleProtectEncoding(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    protectLineLength = 0;
    protectBytes = 0;

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "enctype"sv) {
            auto value = nvp.value->getFirstToken();

            std::string valueText(value.valueText());
            strToLower(valueText);

            if (valueText == "uuencode"sv) {
                protectEncoding = ProtectEncoding::UUEncode;
            }
            else if (valueText == "base64"sv) {
                protectEncoding = ProtectEncoding::Base64;
            }
            else if (valueText == "quoted-printable"sv) {
                protectEncoding = ProtectEncoding::QuotedPrintable;
            }
            else if (valueText == "raw"sv) {
                protectEncoding = ProtectEncoding::Raw;
            }
            else {
                protectEncoding = ProtectEncoding::Raw;
                addDiag(diag::UnknownProtectEncoding, value.range()) << value.valueText();
            }
        }
        else if (name == "line_length"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectLineLength = *num;
        }
        else if (name == "bytes"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectBytes = *num;
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}